

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O3

void mat4x4_look_at(vec4 *m,float *eye,float *center,float *up)

{
  int i;
  long lVar1;
  long lVar2;
  float p;
  float fVar3;
  float fVar4;
  vec3 f;
  vec4 r;
  undefined8 local_90;
  float local_88;
  float local_84;
  undefined8 local_80;
  ulong local_78;
  float local_70;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28 [4];
  
  lVar1 = 0;
  do {
    (&local_84)[lVar1] = center[lVar1] - eye[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + (&local_84)[lVar1] * (&local_84)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  lVar1 = 0;
  do {
    (&local_84)[lVar1] = (&local_84)[lVar1] * (1.0 / fVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_58._0_4_ = (float)local_80;
  local_58._4_4_ = (float)((ulong)local_80 >> 0x20);
  fVar3 = (float)*(undefined8 *)(up + 1);
  fVar4 = (float)((ulong)*(undefined8 *)(up + 1) >> 0x20);
  local_38 = -local_58._4_4_;
  fStack_34 = -local_84;
  fStack_30 = -local_58._4_4_;
  fStack_2c = -local_58._4_4_;
  local_90 = CONCAT44(*up * local_58._4_4_ - fVar4 * local_84,
                      fVar4 * (float)local_58 - fVar3 * local_58._4_4_);
  local_68 = -(float)local_58;
  fStack_64 = -local_58._4_4_;
  local_88 = fVar3 * local_84 - *up * (float)local_58;
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = *(float *)((long)&local_90 + lVar1 * 4);
    fVar3 = fVar3 + fVar4 * fVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar3 < 0.0) {
    local_48 = ZEXT416((uint)local_84);
    local_58 = local_80;
    uStack_50 = 0;
    uStack_60 = 0x80000000;
    uStack_5c = 0x80000000;
    fVar3 = sqrtf(fVar3);
    local_84 = (float)local_48._0_4_;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  lVar1 = 0;
  do {
    *(float *)((long)&local_90 + lVar1 * 4) =
         *(float *)((long)&local_90 + lVar1 * 4) * (1.0 / fVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (*m)[0] = (float)local_90;
  (*m)[1] = local_90._4_4_ * local_58._4_4_ - (float)local_58 * local_88;
  (*m)[2] = fStack_34;
  lVar1 = 0;
  (*m)[3] = 0.0;
  m[1][0] = local_90._4_4_;
  m[1][1] = local_88 * local_84 - local_58._4_4_ * (float)local_90;
  m[1][2] = local_68;
  m[1][3] = 0.0;
  m[2][0] = local_88;
  m[2][1] = (float)local_90 * (float)local_58 - local_84 * local_90._4_4_;
  m[2][2] = local_38;
  *(undefined8 *)(m[2] + 3) = 0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  m[3][3] = 1.0;
  local_78 = *(ulong *)eye ^ 0x8000000080000000;
  local_70 = -eye[2];
  local_6c = 0;
  do {
    local_28[0] = (*m)[lVar1];
    local_28[1] = m[1][lVar1];
    local_28[2] = m[2][lVar1];
    local_28[3] = m[3][lVar1];
    fVar3 = 0.0;
    lVar2 = 0;
    do {
      fVar3 = fVar3 + *(float *)((long)&local_78 + lVar2 * 4) * local_28[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    m[3][lVar1] = fVar3 + m[3][lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

static inline void mat4x4_look_at(mat4x4 m, vec3 eye, vec3 center, vec3 up)
{
	/* Adapted from Android's OpenGL Matrix.java.                        */
	/* See the OpenGL GLUT documentation for gluLookAt for a description */
	/* of the algorithm. We implement it in a straightforward way:       */

	/* TODO: The negation of of can be spared by swapping the order of
	 *       operands in the following cross products in the right way. */
	vec3 f;
	vec3_sub(f, center, eye);	
	vec3_norm(f, f);	
	
	vec3 s;
	vec3_mul_cross(s, f, up);
	vec3_norm(s, s);

	vec3 t;
	vec3_mul_cross(t, s, f);

	m[0][0] =  s[0];
	m[0][1] =  t[0];
	m[0][2] = -f[0];
	m[0][3] =   0.f;

	m[1][0] =  s[1];
	m[1][1] =  t[1];
	m[1][2] = -f[1];
	m[1][3] =   0.f;

	m[2][0] =  s[2];
	m[2][1] =  t[2];
	m[2][2] = -f[2];
	m[2][3] =   0.f;

	m[3][0] =  0.f;
	m[3][1] =  0.f;
	m[3][2] =  0.f;
	m[3][3] =  1.f;

	mat4x4_translate_in_place(m, -eye[0], -eye[1], -eye[2]);
}